

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::UnescapeCEscapeString
              (string *src,string *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *dest_00;
  LogMessage *other;
  LogFinisher local_7a;
  byte local_79;
  LogMessage local_78;
  int local_2c;
  int len;
  scoped_array<char> unescaped;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errors_local;
  string *dest_local;
  string *src_local;
  
  unescaped.array_ = (char *)errors;
  lVar2 = std::__cxx11::string::size();
  pcVar3 = (char *)operator_new__(lVar2 + 1);
  internal::scoped_array<char>::scoped_array((scoped_array<char> *)&stack0xffffffffffffffd8,pcVar3);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  dest_00 = internal::scoped_array<char>::get((scoped_array<char> *)&stack0xffffffffffffffd8);
  local_2c = UnescapeCEscapeSequences
                       (pcVar3,dest_00,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)unescaped.array_);
  local_79 = 0;
  if (dest == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x1da);
    local_79 = 1;
    other = internal::LogMessage::operator<<(&local_78,"CHECK failed: dest: ");
    internal::LogFinisher::operator=(&local_7a,other);
  }
  if ((local_79 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_78);
  }
  pcVar3 = internal::scoped_array<char>::get((scoped_array<char> *)&stack0xffffffffffffffd8);
  std::__cxx11::string::assign((char *)dest,(ulong)pcVar3);
  iVar1 = local_2c;
  internal::scoped_array<char>::~scoped_array((scoped_array<char> *)&stack0xffffffffffffffd8);
  return iVar1;
}

Assistant:

int UnescapeCEscapeString(const string& src, string* dest,
                          vector<string> *errors) {
  scoped_array<char> unescaped(new char[src.size() + 1]);
  int len = UnescapeCEscapeSequences(src.c_str(), unescaped.get(), errors);
  GOOGLE_CHECK(dest);
  dest->assign(unescaped.get(), len);
  return len;
}